

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O2

size_t Assimp::FBX::Util::DecodeBase64(char *in,size_t inLength,uint8_t *out,size_t maxOutLength)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  
  if (inLength < 2 || maxOutLength == 0) {
    return 0;
  }
  cVar1 = in[inLength - 1];
  cVar2 = in[inLength - 2];
  sVar3 = 0;
  uVar5 = 0;
  lVar6 = 0;
  iVar7 = -8;
  while( true ) {
    if ((inLength - (cVar2 == '=')) - (ulong)(cVar1 == '=') == lVar6) {
      return sVar3;
    }
    if (((long)in[lVar6] < 0) || ((byte)base64DecodeTable[in[lVar6]] == 0xff)) break;
    uVar5 = uVar5 * 0x40 + (uint)(byte)base64DecodeTable[in[lVar6]];
    iVar4 = iVar7 + 6;
    if (-7 < iVar7) {
      out[sVar3] = (uint8_t)((int)uVar5 >> ((byte)iVar4 & 0x1f));
      sVar3 = sVar3 + 1;
      iVar4 = iVar7 + -2;
      uVar5 = uVar5 & 0xfff;
    }
    lVar6 = lVar6 + 1;
    iVar7 = iVar4;
  }
  return 0;
}

Assistant:

size_t DecodeBase64(const char* in, size_t inLength, uint8_t* out, size_t maxOutLength)
{
    if (maxOutLength == 0 || inLength < 2) {
        return 0;
    }
    const size_t realLength = inLength - size_t(in[inLength - 1] == '=') - size_t(in[inLength - 2] == '=');
    size_t dst_offset = 0;
    int val = 0, valb = -8;
    for (size_t src_offset = 0; src_offset < realLength; ++src_offset)
    {
        const uint8_t table_value = Util::DecodeBase64(in[src_offset]);
        if (table_value == 255)
        {
            return 0;
        }
        val = (val << 6) + table_value;
        valb += 6;
        if (valb >= 0)
        {
            out[dst_offset++] = static_cast<uint8_t>((val >> valb) & 0xFF);
            valb -= 8;
            val &= 0xFFF;
        }
    }
    return dst_offset;
}